

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O3

void generateMipmaps(ktxVulkanTexture *vkTexture,ktxVulkanDeviceInfo *vdi,VkFilter blitFilter,
                    VkImageLayout initialLayout)

{
  ktxVulkanFunctions vkFuncs;
  ktxVulkanFunctions vkFuncs_00;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  byte bVar1;
  uint uVar2;
  undefined4 in_register_00000014;
  undefined8 uVar3;
  PFN_vkWaitForFences unaff_RBX;
  uint uVar4;
  undefined8 unaff_R12;
  undefined8 unaff_R13;
  uint32_t unaff_R14D;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined1 *puVar5;
  VkStructureType in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  void *in_stack_ffffffffffffff10;
  VkAccessFlags in_stack_ffffffffffffff18;
  VkAccessFlags in_stack_ffffffffffffff1c;
  VkImageLayout in_stack_ffffffffffffff20;
  VkImageLayout in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  VkImage in_stack_ffffffffffffff30;
  VkImageAspectFlags in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  uint32_t in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff44;
  uint32_t in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 uVar6;
  undefined4 uVar7;
  uint32_t uVar8;
  undefined1 in_stack_ffffffffffffff6c [12];
  VkImageAspectFlags in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  int32_t in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  VkImageAspectFlags in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  uint32_t in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  int32_t in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  uVar3 = CONCAT44(in_register_00000014,blitFilter);
  uVar6 = 1;
  uVar7 = 0;
  uVar8 = vkTexture->layerCount;
  vkFuncs.vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)0x1;
  vkFuncs.vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)0x1;
  vkFuncs.vkAllocateCommandBuffers._0_4_ = uVar8;
  vkFuncs.vkAllocateCommandBuffers._4_4_ = in_stack_fffffffffffffefc;
  vkFuncs.vkAllocateMemory._0_4_ = in_stack_ffffffffffffff00;
  vkFuncs.vkAllocateMemory._4_4_ = in_stack_ffffffffffffff04;
  vkFuncs.vkBeginCommandBuffer._0_4_ = in_stack_ffffffffffffff08;
  vkFuncs.vkBeginCommandBuffer._4_4_ = in_stack_ffffffffffffff0c;
  vkFuncs.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_ffffffffffffff10;
  vkFuncs.vkBindImageMemory._0_4_ = in_stack_ffffffffffffff18;
  vkFuncs.vkBindImageMemory._4_4_ = in_stack_ffffffffffffff1c;
  vkFuncs.vkCmdBlitImage._0_4_ = in_stack_ffffffffffffff20;
  vkFuncs.vkCmdBlitImage._4_4_ = in_stack_ffffffffffffff24;
  vkFuncs.vkCmdCopyBufferToImage = (PFN_vkCmdCopyBufferToImage)in_stack_ffffffffffffff28;
  vkFuncs.vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)in_stack_ffffffffffffff30;
  vkFuncs.vkCreateImage._0_4_ = in_stack_ffffffffffffff38;
  vkFuncs.vkCreateImage._4_4_ = in_stack_ffffffffffffff3c;
  vkFuncs.vkDestroyImage._0_4_ = in_stack_ffffffffffffff40;
  vkFuncs.vkDestroyImage._4_4_ = in_stack_ffffffffffffff44;
  vkFuncs.vkCreateBuffer._0_4_ = in_stack_ffffffffffffff48;
  vkFuncs.vkCreateBuffer._4_4_ = in_stack_ffffffffffffff4c;
  vkFuncs.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_ffffffffffffff50;
  vkFuncs.vkCreateFence = (PFN_vkCreateFence)0x1;
  vkFuncs.vkDestroyFence._0_4_ = 1;
  vkFuncs.vkDestroyFence._4_4_ = 0;
  vkFuncs.vkEndCommandBuffer._0_4_ = uVar8;
  vkFuncs._132_12_ = in_stack_ffffffffffffff6c;
  vkFuncs.vkFreeMemory = (PFN_vkFreeMemory)uVar3;
  vkFuncs.vkGetBufferMemoryRequirements._0_4_ = in_stack_ffffffffffffff80;
  vkFuncs.vkGetBufferMemoryRequirements._4_4_ = in_stack_ffffffffffffff84;
  vkFuncs.vkGetImageMemoryRequirements._0_4_ = in_stack_ffffffffffffff88;
  vkFuncs.vkGetImageMemoryRequirements._4_4_ = in_stack_ffffffffffffff8c;
  vkFuncs.vkGetImageSubresourceLayout = (PFN_vkGetImageSubresourceLayout)in_stack_ffffffffffffff90;
  vkFuncs.vkGetPhysicalDeviceImageFormatProperties._0_4_ = in_stack_ffffffffffffff98;
  vkFuncs.vkGetPhysicalDeviceImageFormatProperties._4_4_ = in_stack_ffffffffffffff9c;
  vkFuncs.vkGetPhysicalDeviceFormatProperties._0_4_ = in_stack_ffffffffffffffa0;
  vkFuncs.vkGetPhysicalDeviceFormatProperties._4_4_ = in_stack_ffffffffffffffa4;
  vkFuncs.vkGetPhysicalDeviceMemoryProperties._0_4_ = in_stack_ffffffffffffffa8;
  vkFuncs.vkGetPhysicalDeviceMemoryProperties._4_4_ = in_stack_ffffffffffffffac;
  vkFuncs.vkMapMemory._0_4_ = in_stack_ffffffffffffffb0;
  vkFuncs.vkMapMemory._4_4_ = in_stack_ffffffffffffffb4;
  vkFuncs.vkQueueSubmit._0_4_ = in_stack_ffffffffffffffb8;
  vkFuncs._212_8_ = in_stack_ffffffffffffffbc;
  vkFuncs.vkQueueWaitIdle._4_4_ = in_stack_ffffffffffffffc4;
  vkFuncs.vkUnmapMemory._0_4_ = in_stack_ffffffffffffffc8;
  vkFuncs.vkUnmapMemory._4_4_ = in_stack_ffffffffffffffcc;
  vkFuncs.vkWaitForFences = unaff_RBX;
  subresourceRange._8_8_ = unaff_R13;
  subresourceRange._0_8_ = unaff_R12;
  subresourceRange.layerCount = unaff_R14D;
  setImageLayout(vkFuncs,(VkCommandBuffer)(vdi->vkFuncs).vkCmdPipelineBarrier,
                 (VkImage)vdi->cmdBuffer,(VkImageLayout)vkTexture->image,initialLayout,
                 subresourceRange);
  puVar5 = (undefined1 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
  uVar2 = vkTexture->levelCount;
  if (1 < uVar2) {
    uVar4 = 1;
    do {
      in_stack_ffffffffffffffb8 = 0;
      in_stack_ffffffffffffffbc._0_4_ = 0;
      in_stack_ffffffffffffffbc._4_4_ = 0;
      in_stack_ffffffffffffffb0 = 0;
      in_stack_ffffffffffffff98 = 0;
      in_stack_ffffffffffffff88 = 0;
      in_stack_ffffffffffffff90._0_4_ = 0;
      in_stack_ffffffffffffff90._4_4_ = 0;
      in_stack_ffffffffffffff80 = 1;
      in_stack_ffffffffffffff48 = vkTexture->layerCount;
      in_stack_ffffffffffffff84 = uVar4 - 1;
      bVar1 = (byte)in_stack_ffffffffffffff84;
      uVar2 = vkTexture->width >> (bVar1 & 0x1f);
      in_stack_ffffffffffffff9c = uVar2 + (uVar2 == 0);
      uVar2 = vkTexture->height >> (bVar1 & 0x1f);
      in_stack_ffffffffffffffa0 = uVar2 + (uVar2 == 0);
      uVar2 = vkTexture->depth >> (bVar1 & 0x1f);
      in_stack_ffffffffffffffa4 = uVar2 + (uVar2 == 0);
      in_stack_ffffffffffffffa8 = 1;
      in_stack_ffffffffffffffb4 = 1;
      bVar1 = (byte)uVar4;
      uVar2 = vkTexture->width >> (bVar1 & 0x1f);
      in_stack_ffffffffffffffc4 = uVar2 + (uVar2 == 0);
      uVar2 = vkTexture->height >> (bVar1 & 0x1f);
      in_stack_ffffffffffffffc8 = uVar2 + (uVar2 == 0);
      uVar2 = vkTexture->depth >> (bVar1 & 0x1f);
      in_stack_ffffffffffffffcc = uVar2 + (uVar2 == 0);
      in_stack_ffffffffffffff8c = in_stack_ffffffffffffff48;
      in_stack_ffffffffffffffac = uVar4;
      (*(vdi->vkFuncs).vkCmdPipelineBarrier)
                (vdi->cmdBuffer,0x10000,0x10000,0,0,(VkMemoryBarrier *)0x0,0,
                 (VkBufferMemoryBarrier *)0x0,1,(VkImageMemoryBarrier *)&stack0xffffffffffffff08);
      (*(vdi->vkFuncs).vkCmdBlitImage)
                (vdi->cmdBuffer,vkTexture->image,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                 vkTexture->image,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,1,
                 (VkImageBlit *)&stack0xffffffffffffff80,(VkFilter)uVar3);
      in_stack_ffffffffffffff30 = vkTexture->image;
      in_stack_ffffffffffffff0c = 0;
      in_stack_ffffffffffffff10 = (void *)0x0;
      in_stack_ffffffffffffff44 = 0;
      in_stack_ffffffffffffff4c = 0;
      in_stack_ffffffffffffff08 = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
      in_stack_ffffffffffffff28._0_4_ = 0xffffffff;
      in_stack_ffffffffffffff28._4_4_ = 0xffffffff;
      in_stack_ffffffffffffff38 = 1;
      in_stack_ffffffffffffff40 = 1;
      in_stack_ffffffffffffff18 = 0x1800;
      in_stack_ffffffffffffff1c = 0x800;
      in_stack_ffffffffffffff20 = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
      in_stack_ffffffffffffff24 = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
      in_stack_fffffffffffffefc = 0;
      in_stack_ffffffffffffff3c = uVar4;
      puVar5 = &stack0xffffffffffffff08;
      (*(vdi->vkFuncs).vkCmdPipelineBarrier)
                (vdi->cmdBuffer,0x10000,0x10000,0,0,(VkMemoryBarrier *)0x0,0,
                 (VkBufferMemoryBarrier *)0x0,1,(VkImageMemoryBarrier *)&stack0xffffffffffffff08);
      uVar4 = uVar4 + 1;
      uVar2 = vkTexture->levelCount;
    } while (uVar4 < uVar2);
  }
  vkFuncs_00.vkGetDeviceProcAddr._4_4_ = uVar7;
  vkFuncs_00.vkGetDeviceProcAddr._0_4_ = uVar2;
  vkFuncs_00.vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)uVar6;
  vkFuncs_00.vkAllocateCommandBuffers._0_4_ = uVar8;
  vkFuncs_00.vkAllocateCommandBuffers._4_4_ = in_stack_fffffffffffffefc;
  vkFuncs_00.vkAllocateMemory._0_4_ = (int)puVar5;
  vkFuncs_00.vkAllocateMemory._4_4_ = (int)((ulong)puVar5 >> 0x20);
  vkFuncs_00.vkBeginCommandBuffer._0_4_ = in_stack_ffffffffffffff08;
  vkFuncs_00.vkBeginCommandBuffer._4_4_ = in_stack_ffffffffffffff0c;
  vkFuncs_00.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_ffffffffffffff10;
  vkFuncs_00.vkBindImageMemory._0_4_ = in_stack_ffffffffffffff18;
  vkFuncs_00.vkBindImageMemory._4_4_ = in_stack_ffffffffffffff1c;
  vkFuncs_00.vkCmdBlitImage._0_4_ = in_stack_ffffffffffffff20;
  vkFuncs_00.vkCmdBlitImage._4_4_ = in_stack_ffffffffffffff24;
  vkFuncs_00.vkCmdCopyBufferToImage = (PFN_vkCmdCopyBufferToImage)in_stack_ffffffffffffff28;
  vkFuncs_00.vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)in_stack_ffffffffffffff30;
  vkFuncs_00.vkCreateImage._0_4_ = in_stack_ffffffffffffff38;
  vkFuncs_00.vkCreateImage._4_4_ = in_stack_ffffffffffffff3c;
  vkFuncs_00.vkDestroyImage._0_4_ = in_stack_ffffffffffffff40;
  vkFuncs_00.vkDestroyImage._4_4_ = in_stack_ffffffffffffff44;
  vkFuncs_00.vkCreateBuffer._0_4_ = in_stack_ffffffffffffff48;
  vkFuncs_00.vkCreateBuffer._4_4_ = in_stack_ffffffffffffff4c;
  vkFuncs_00.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_ffffffffffffff50;
  vkFuncs_00.vkCreateFence = (PFN_vkCreateFence)uVar6;
  vkFuncs_00.vkDestroyFence._0_4_ = uVar2;
  vkFuncs_00.vkDestroyFence._4_4_ = uVar7;
  vkFuncs_00.vkEndCommandBuffer._0_4_ = uVar8;
  vkFuncs_00._132_12_ = in_stack_ffffffffffffff6c;
  vkFuncs_00.vkFreeMemory = (PFN_vkFreeMemory)uVar3;
  vkFuncs_00.vkGetBufferMemoryRequirements._0_4_ = in_stack_ffffffffffffff80;
  vkFuncs_00.vkGetBufferMemoryRequirements._4_4_ = in_stack_ffffffffffffff84;
  vkFuncs_00.vkGetImageMemoryRequirements._0_4_ = in_stack_ffffffffffffff88;
  vkFuncs_00.vkGetImageMemoryRequirements._4_4_ = in_stack_ffffffffffffff8c;
  vkFuncs_00.vkGetImageSubresourceLayout =
       (PFN_vkGetImageSubresourceLayout)in_stack_ffffffffffffff90;
  vkFuncs_00.vkGetPhysicalDeviceImageFormatProperties._0_4_ = in_stack_ffffffffffffff98;
  vkFuncs_00.vkGetPhysicalDeviceImageFormatProperties._4_4_ = in_stack_ffffffffffffff9c;
  vkFuncs_00.vkGetPhysicalDeviceFormatProperties._0_4_ = in_stack_ffffffffffffffa0;
  vkFuncs_00.vkGetPhysicalDeviceFormatProperties._4_4_ = in_stack_ffffffffffffffa4;
  vkFuncs_00.vkGetPhysicalDeviceMemoryProperties._0_4_ = in_stack_ffffffffffffffa8;
  vkFuncs_00.vkGetPhysicalDeviceMemoryProperties._4_4_ = in_stack_ffffffffffffffac;
  vkFuncs_00.vkMapMemory._0_4_ = in_stack_ffffffffffffffb0;
  vkFuncs_00.vkMapMemory._4_4_ = in_stack_ffffffffffffffb4;
  vkFuncs_00.vkQueueSubmit._0_4_ = in_stack_ffffffffffffffb8;
  vkFuncs_00._212_8_ = in_stack_ffffffffffffffbc;
  vkFuncs_00.vkQueueWaitIdle._4_4_ = in_stack_ffffffffffffffc4;
  vkFuncs_00.vkUnmapMemory._0_4_ = in_stack_ffffffffffffffc8;
  vkFuncs_00.vkUnmapMemory._4_4_ = in_stack_ffffffffffffffcc;
  vkFuncs_00.vkWaitForFences = unaff_RBX;
  subresourceRange_00.levelCount = (int)unaff_R13;
  subresourceRange_00.baseArrayLayer = (int)((ulong)unaff_R13 >> 0x20);
  subresourceRange_00.aspectMask = (int)unaff_R12;
  subresourceRange_00.baseMipLevel = (int)((ulong)unaff_R12 >> 0x20);
  subresourceRange_00.layerCount = unaff_R14D;
  setImageLayout(vkFuncs_00,(VkCommandBuffer)(vdi->vkFuncs).vkCmdPipelineBarrier,
                 (VkImage)vdi->cmdBuffer,(VkImageLayout)vkTexture->image,
                 VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,subresourceRange_00);
  return;
}

Assistant:

static void
generateMipmaps(ktxVulkanTexture* vkTexture, ktxVulkanDeviceInfo* vdi,
                VkFilter blitFilter, VkImageLayout initialLayout)
{
    VkImageSubresourceRange subresourceRange;
    memset(&subresourceRange, 0, sizeof(subresourceRange));
    subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    subresourceRange.baseMipLevel = 0;
    subresourceRange.levelCount = 1;
    subresourceRange.baseArrayLayer = 0;
    subresourceRange.layerCount = vkTexture->layerCount;

    // Transition base level to SRC_OPTIMAL for blitting.
    setImageLayout(
        vdi->vkFuncs,
        vdi->cmdBuffer,
        vkTexture->image,
        initialLayout,
        VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
        subresourceRange);

    // Generate the mip chain
    // ----------------------
    // Blit level n from level n-1.
    for (uint32_t i = 1; i < vkTexture->levelCount; i++)
    {
        VkImageBlit imageBlit;
        memset(&imageBlit, 0, sizeof(imageBlit));

        // Source
        imageBlit.srcSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        imageBlit.srcSubresource.layerCount = vkTexture->layerCount;
        imageBlit.srcSubresource.mipLevel = i-1;
        imageBlit.srcOffsets[1].x = MAX(1, vkTexture->width >> (i - 1));
        imageBlit.srcOffsets[1].y = MAX(1, vkTexture->height >> (i - 1));
        imageBlit.srcOffsets[1].z = MAX(1, vkTexture->depth >> (i - 1));;

        // Destination
        imageBlit.dstSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        imageBlit.dstSubresource.layerCount = 1;
        imageBlit.dstSubresource.mipLevel = i;
        imageBlit.dstOffsets[1].x = MAX(1, vkTexture->width >> i);
        imageBlit.dstOffsets[1].y = MAX(1, vkTexture->height >> i);
        imageBlit.dstOffsets[1].z = MAX(1, vkTexture->depth >> i);

        VkImageSubresourceRange mipSubRange;
        memset(&mipSubRange, 0, sizeof(mipSubRange));

        mipSubRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        mipSubRange.baseMipLevel = i;
        mipSubRange.levelCount = 1;
        mipSubRange.layerCount = vkTexture->layerCount;

        // Transiton current mip level to transfer dest
        setImageLayout(
            vdi->vkFuncs,
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_UNDEFINED,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            mipSubRange);

        // Blit from previous level
        vdi->vkFuncs.vkCmdBlitImage(
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
            vkTexture->image,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            1,
            &imageBlit,
            blitFilter);

        // Transiton current mip level to transfer source for read in
        // next iteration.
        setImageLayout(
            vdi->vkFuncs,
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
            mipSubRange);
    }

    // After the loop, all mip layers are in TRANSFER_SRC layout.
    // Transition all to final layout.
    subresourceRange.levelCount = vkTexture->levelCount;
    setImageLayout(
        vdi->vkFuncs,
        vdi->cmdBuffer,
        vkTexture->image,
        VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
        vkTexture->imageLayout,
        subresourceRange);
}